

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O1

bool P_Thing_Raise(AActor *thing,AActor *raiser)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  BYTE *pBVar4;
  bool bVar5;
  int iVar6;
  FState *newstate;
  undefined4 extraout_var;
  FSoundID local_3c;
  DVector2 local_38;
  
  newstate = AActor::GetRaiseState(thing);
  if (newstate == (FState *)0x0) {
    bVar5 = true;
  }
  else {
    if ((thing->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar6 = (**(thing->super_DThinker).super_DObject._vptr_DObject)(thing);
      (thing->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar6);
    }
    pBVar4 = ((thing->super_DThinker).super_DObject.Class)->Defaults;
    (thing->Vel).X = 0.0;
    (thing->Vel).Y = 0.0;
    dVar1 = thing->Height;
    dVar2 = thing->radius;
    uVar3 = (thing->flags).Value;
    (thing->flags).Value = uVar3 | 2;
    thing->Height = *(double *)(pBVar4 + 0x180);
    thing->radius = *(double *)(pBVar4 + 0x178);
    local_38.X = (thing->__Pos).X;
    local_38.Y = (thing->__Pos).Y;
    bVar5 = P_CheckPosition(thing,&local_38,false);
    if (bVar5) {
      local_3c.ID = S_FindSound("vile/raise");
      S_Sound(thing,4,&local_3c,1.0,1.001);
      AActor::Revive(thing);
      if (raiser != (AActor *)0x0) {
        AActor::CopyFriendliness(thing,raiser,false,true);
      }
      AActor::SetState(thing,newstate,false);
    }
    else {
      (thing->flags).Value = uVar3;
      thing->radius = dVar2;
      thing->Height = dVar1;
    }
  }
  return bVar5;
}

Assistant:

bool P_Thing_Raise(AActor *thing, AActor *raiser)
{
	FState * RaiseState = thing->GetRaiseState();
	if (RaiseState == NULL)
	{
		return true;	// monster doesn't have a raise state
	}
	
	AActor *info = thing->GetDefault ();

	thing->Vel.X = thing->Vel.Y = 0;

	// [RH] Check against real height and radius
	double oldheight = thing->Height;
	double oldradius = thing->radius;
	ActorFlags oldflags = thing->flags;

	thing->flags |= MF_SOLID;
	thing->Height = info->Height;	// [RH] Use real height
	thing->radius = info->radius;	// [RH] Use real radius
	if (!P_CheckPosition (thing, thing->Pos()))
	{
		thing->flags = oldflags;
		thing->radius = oldradius;
		thing->Height = oldheight;
		return false;
	}


	S_Sound (thing, CHAN_BODY, "vile/raise", 1, ATTN_IDLE);

	thing->Revive();

	if (raiser != NULL)
	{
		// Let's copy the friendliness of the one who raised it.
		thing->CopyFriendliness(raiser, false);
	}

	thing->SetState (RaiseState);
	return true;
}